

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest_rewriter.cpp
# Opt level: O1

void __thiscall
duckdb::UnnestRewriter::UpdateRHSBindings
          (UnnestRewriter *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *candidate,UnnestRewriterPlanUpdater *updater)

{
  vector<duckdb::LHSBinding,_true> *this_00;
  pointer *ppRVar1;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  pointer pLVar2;
  pointer pLVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  idx_t iVar5;
  iterator iVar6;
  pointer pRVar7;
  pointer puVar8;
  pointer puVar9;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var10;
  type pLVar11;
  LogicalProjection *pLVar12;
  reference pvVar13;
  pointer this_02;
  reference pvVar14;
  LogicalUnnest *pLVar15;
  reference ppuVar16;
  reference pvVar17;
  reference pvVar18;
  reference args_2;
  pointer *__ptr_1;
  pointer puVar19;
  pointer puVar20;
  size_type sVar21;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_03;
  size_type __n;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *temp_bound_unnest;
  ulong uVar22;
  pointer puVar23;
  size_type sVar24;
  pointer *__ptr;
  idx_t iVar25;
  pointer puVar26;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *temp_bound_unnest_1
  ;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *__args;
  templated_unique_single_t new_expr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  temp_bound_unnests;
  type temp_unnest_child;
  value_type *curr_op;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_true>
  path_to_unnest;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  existing_expressions;
  Expression *local_c0;
  ReplaceBinding local_b8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_true>
  local_78;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_58;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_40;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_38;
  
  local_40 = plan;
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(candidate);
  pLVar2 = (this->lhs_bindings).
           super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>.
           super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar3 = (this->lhs_bindings).
           super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>.
           super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> **)
       0x0;
  local_78.
  super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> **)
       0x0;
  local_38 = &pLVar11->children;
  local_88 = &vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](local_38,0)->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ;
  this_00 = &this->lhs_bindings;
  while (((((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
           &local_88->_M_t)->_M_t).
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->type ==
         LOGICAL_PROJECTION) {
    if (local_78.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>*,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>*>>
      ::
      _M_realloc_insert<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>*const&>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>*,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>*>>
                  *)&local_78,
                 (iterator)
                 local_78.
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  **)&local_88);
    }
    else {
      *local_78.
       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            *)local_88;
      local_78.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pLVar12 = LogicalOperator::Cast<duckdb::LogicalProjection>
                        ((((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            *)&local_88->_M_t)->_M_t).
                         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
    if (this->distinct_unnest_count != 0) {
      uVar22 = 0;
      do {
        puVar26 = (pLVar12->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar20 = puVar26 + -1;
        (pLVar12->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar20;
        _Var4._M_head_impl =
             puVar26[-1].
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        if (_Var4._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
        }
        (puVar20->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->distinct_unnest_count);
    }
    if ((pLVar12->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pLVar12->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar5 = pLVar12->table_index;
      iVar25 = 0;
      do {
        local_b8.new_binding.column_index =
             ((long)pLVar2 - (long)pLVar3 >> 3) * -0x71c71c71c71c71c7 + iVar25;
        iVar6._M_current =
             (updater->replace_bindings).
             super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
             super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_b8.old_binding.table_index = iVar5;
        local_b8.old_binding.column_index = iVar25;
        local_b8.new_binding.table_index = iVar5;
        if (iVar6._M_current ==
            (updater->replace_bindings).
            super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
            super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::ReplaceBinding,std::allocator<duckdb::ReplaceBinding>>::
          _M_realloc_insert<duckdb::ReplaceBinding_const&>
                    ((vector<duckdb::ReplaceBinding,std::allocator<duckdb::ReplaceBinding>> *)
                     &updater->replace_bindings,iVar6,&local_b8);
        }
        else {
          ((iVar6._M_current)->new_binding).table_index = iVar5;
          ((iVar6._M_current)->new_binding).column_index = local_b8.new_binding.column_index;
          ((iVar6._M_current)->old_binding).table_index = iVar5;
          ((iVar6._M_current)->old_binding).column_index = iVar25;
          ppRVar1 = &(updater->replace_bindings).
                     super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
                     super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + 1;
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 < (ulong)((long)(pLVar12->super_LogicalOperator).expressions.
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pLVar12->super_LogicalOperator).expressions.
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_88 = &vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&((((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                  *)&local_88->_M_t)->_M_t).
                               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                              )->children,0)->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
    ;
  }
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator*
            (local_40);
  (*(updater->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(updater);
  pRVar7 = (updater->replace_bindings).
           super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((updater->replace_bindings).
      super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
      super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar7) {
    (updater->replace_bindings).
    super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
    super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar7;
  }
  pvVar13 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](local_38,0);
  this_02 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar13);
  pLVar12 = LogicalOperator::Cast<duckdb::LogicalProjection>(this_02);
  if ((this->lhs_bindings).super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>.
      super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->lhs_bindings).super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>.
      super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar21 = 0;
    do {
      pvVar14 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
      local_b8.new_binding.table_index = pLVar12->table_index;
      local_b8.old_binding.table_index = (pvVar14->binding).table_index;
      local_b8.old_binding.column_index = (pvVar14->binding).column_index;
      iVar6._M_current =
           (updater->replace_bindings).
           super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_b8.new_binding.column_index = sVar21;
      if (iVar6._M_current ==
          (updater->replace_bindings).
          super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
          super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::ReplaceBinding,std::allocator<duckdb::ReplaceBinding>>::
        _M_realloc_insert<duckdb::ReplaceBinding_const&>
                  ((vector<duckdb::ReplaceBinding,std::allocator<duckdb::ReplaceBinding>> *)
                   &updater->replace_bindings,iVar6,&local_b8);
      }
      else {
        ((iVar6._M_current)->new_binding).table_index = local_b8.new_binding.table_index;
        ((iVar6._M_current)->new_binding).column_index = sVar21;
        ((iVar6._M_current)->old_binding).table_index = local_b8.old_binding.table_index;
        ((iVar6._M_current)->old_binding).column_index = local_b8.old_binding.column_index;
        ppRVar1 = &(updater->replace_bindings).
                   super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
                   super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 < (ulong)(((long)(this->lhs_bindings).
                                     super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                     .
                                     super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->lhs_bindings).
                                     super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                     .
                                     super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  pLVar15 = LogicalOperator::Cast<duckdb::LogicalUnnest>
                      ((((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          *)&local_88->_M_t)->_M_t).
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_b8.old_binding.table_index = 0;
  local_b8.old_binding.column_index = 0;
  local_b8.new_binding.table_index = 0;
  puVar20 = (pLVar15->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar26 = (pLVar15->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != puVar26) {
    do {
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_b8,puVar20);
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar26);
  }
  this_01 = &(pLVar15->super_LogicalOperator).children;
  pvVar13 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](this_01,0);
  local_90._M_head_impl =
       (pvVar13->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar13->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  puVar20 = (pLVar15->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar26 = (pLVar15->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar19 = puVar20;
  if (puVar26 != puVar20) {
    do {
      _Var4._M_head_impl =
           (puVar19->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      if (_Var4._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
      }
      (puVar19->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar26);
    (pLVar15->super_LogicalOperator).expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar20;
  }
  puVar8 = (pLVar15->super_LogicalOperator).children.
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (pLVar15->super_LogicalOperator).children.
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar23 = puVar8;
  if (puVar9 != puVar8) {
    do {
      _Var10._M_head_impl =
           (puVar23->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if (_Var10._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var10._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      (puVar23->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar9);
    (pLVar15->super_LogicalOperator).children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar8;
  }
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(local_40);
  (*(updater->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(updater,pLVar11);
  iVar5 = local_b8.old_binding.column_index;
  pRVar7 = (updater->replace_bindings).
           super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((updater->replace_bindings).
      super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
      super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar7) {
    (updater->replace_bindings).
    super_vector<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>.
    super__Vector_base<duckdb::ReplaceBinding,_std::allocator<duckdb::ReplaceBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar7;
  }
  if (local_b8.old_binding.table_index != local_b8.old_binding.column_index) {
    __args = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_b8.old_binding.table_index;
    do {
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&(pLVar15->super_LogicalOperator).expressions,__args);
      __args = __args + 1;
    } while (__args != (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)iVar5);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)this_01,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_90);
  if ((long)local_78.
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78.
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    __n = (long)local_78.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
    do {
      __n = __n - 1;
      ppuVar16 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_true>
                 ::operator[](&local_78,__n);
      pLVar12 = LogicalOperator::Cast<duckdb::LogicalProjection>
                          (((*ppuVar16)->
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
      local_58.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_03 = &(pLVar12->super_LogicalOperator).expressions;
      puVar20 = (pLVar12->super_LogicalOperator).expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (pLVar12->super_LogicalOperator).expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar26 != puVar20) {
        sVar24 = 0;
        do {
          pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](this_03,sVar24);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_58,pvVar17);
          sVar24 = sVar24 + 1;
          puVar20 = (pLVar12->super_LogicalOperator).expressions.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar26 = (pLVar12->super_LogicalOperator).expressions.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (sVar24 < (ulong)((long)puVar26 - (long)puVar20 >> 3));
      }
      puVar19 = puVar20;
      if (puVar26 != puVar20) {
        do {
          _Var4._M_head_impl =
               (puVar19->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          if (_Var4._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
          }
          (puVar19->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          puVar19 = puVar19 + 1;
        } while (puVar19 != puVar26);
        (pLVar12->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar20;
      }
      if ((this->lhs_bindings).super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
          .super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->lhs_bindings).super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
          .super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar21 = 0;
        do {
          pvVar14 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
          pvVar18 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
          args_2 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
          make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string&,duckdb::LogicalType&,duckdb::ColumnBinding&>
                    ((duckdb *)&local_c0,&pvVar14->alias,&pvVar18->type,&args_2->binding);
          local_80._M_head_impl = local_c0;
          local_c0 = (Expression *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)this_03,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_80);
          if (local_80._M_head_impl != (Expression *)0x0) {
            (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          iVar5 = pLVar12->table_index;
          pvVar14 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
          (pvVar14->binding).table_index = iVar5;
          pvVar14 = vector<duckdb::LHSBinding,_true>::operator[](this_00,sVar21);
          (pvVar14->binding).column_index = sVar21;
          if (local_c0 != (Expression *)0x0) {
            (*(local_c0->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          sVar21 = sVar21 + 1;
        } while (sVar21 < (ulong)(((long)(this->lhs_bindings).
                                         super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                         .
                                         super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->lhs_bindings).
                                         super_vector<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                         .
                                         super__Vector_base<duckdb::LHSBinding,_std::allocator<duckdb::LHSBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x71c71c71c71c71c7));
      }
      if (local_58.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_58.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar24 = 0;
        do {
          pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&local_58,sVar24);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)this_03,pvVar17);
          sVar24 = sVar24 + 1;
        } while (sVar24 < (ulong)((long)local_58.
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_58.
                                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_58);
    } while (__n != 0);
  }
  if (local_90._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_90._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_b8);
  if (local_78.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void UnnestRewriter::UpdateRHSBindings(unique_ptr<LogicalOperator> &plan, unique_ptr<LogicalOperator> &candidate,
                                       UnnestRewriterPlanUpdater &updater) {

	auto &topmost_op = *candidate;
	idx_t shift = lhs_bindings.size();

	vector<unique_ptr<LogicalOperator> *> path_to_unnest;
	auto curr_op = &topmost_op.children[0];
	while (curr_op->get()->type == LogicalOperatorType::LOGICAL_PROJECTION) {

		path_to_unnest.push_back(curr_op);
		D_ASSERT(curr_op->get()->type == LogicalOperatorType::LOGICAL_PROJECTION);
		auto &proj = curr_op->get()->Cast<LogicalProjection>();

		// pop the unnest columns and the delim index
		D_ASSERT(proj.expressions.size() > distinct_unnest_count);
		for (idx_t i = 0; i < distinct_unnest_count; i++) {
			proj.expressions.pop_back();
		}

		// store all shifted current bindings
		idx_t tbl_idx = proj.table_index;
		for (idx_t i = 0; i < proj.expressions.size(); i++) {
			ReplaceBinding replace_binding(ColumnBinding(tbl_idx, i), ColumnBinding(tbl_idx, i + shift));
			updater.replace_bindings.push_back(replace_binding);
		}

		curr_op = &curr_op->get()->children[0];
	}

	// update all bindings by shifting them
	updater.VisitOperator(*plan);
	updater.replace_bindings.clear();

	// update all bindings coming from the LHS to RHS bindings
	D_ASSERT(topmost_op.children[0]->type == LogicalOperatorType::LOGICAL_PROJECTION);
	auto &top_proj = topmost_op.children[0]->Cast<LogicalProjection>();
	for (idx_t i = 0; i < lhs_bindings.size(); i++) {
		ReplaceBinding replace_binding(lhs_bindings[i].binding, ColumnBinding(top_proj.table_index, i));
		updater.replace_bindings.push_back(replace_binding);
	}

	// temporarily remove the BOUND_UNNESTs and the child of the LOGICAL_UNNEST from the plan
	D_ASSERT(curr_op->get()->type == LogicalOperatorType::LOGICAL_UNNEST);
	auto &unnest = curr_op->get()->Cast<LogicalUnnest>();
	vector<unique_ptr<Expression>> temp_bound_unnests;
	for (auto &temp_bound_unnest : unnest.expressions) {
		temp_bound_unnests.push_back(std::move(temp_bound_unnest));
	}
	D_ASSERT(unnest.children.size() == 1);
	auto temp_unnest_child = std::move(unnest.children[0]);
	unnest.expressions.clear();
	unnest.children.clear();
	// update the bindings of the plan
	updater.VisitOperator(*plan);
	updater.replace_bindings.clear();
	// add the children again
	for (auto &temp_bound_unnest : temp_bound_unnests) {
		unnest.expressions.push_back(std::move(temp_bound_unnest));
	}
	unnest.children.push_back(std::move(temp_unnest_child));

	// add the LHS expressions to each LOGICAL_PROJECTION
	for (idx_t i = path_to_unnest.size(); i > 0; i--) {

		D_ASSERT(path_to_unnest[i - 1]->get()->type == LogicalOperatorType::LOGICAL_PROJECTION);
		auto &proj = path_to_unnest[i - 1]->get()->Cast<LogicalProjection>();

		// temporarily store the existing expressions
		vector<unique_ptr<Expression>> existing_expressions;
		for (idx_t expr_idx = 0; expr_idx < proj.expressions.size(); expr_idx++) {
			existing_expressions.push_back(std::move(proj.expressions[expr_idx]));
		}

		proj.expressions.clear();

		// add the new expressions
		for (idx_t expr_idx = 0; expr_idx < lhs_bindings.size(); expr_idx++) {
			auto new_expr = make_uniq<BoundColumnRefExpression>(
			    lhs_bindings[expr_idx].alias, lhs_bindings[expr_idx].type, lhs_bindings[expr_idx].binding);
			proj.expressions.push_back(std::move(new_expr));

			// update the table index
			lhs_bindings[expr_idx].binding.table_index = proj.table_index;
			lhs_bindings[expr_idx].binding.column_index = expr_idx;
		}

		// add the existing expressions again
		for (idx_t expr_idx = 0; expr_idx < existing_expressions.size(); expr_idx++) {
			proj.expressions.push_back(std::move(existing_expressions[expr_idx]));
		}
	}
}